

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::RowObjPS::execute
          (RowObjPS *this,VectorBase<double> *x,VectorBase<double> *y,VectorBase<double> *s,
          VectorBase<double> *param_5,DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  VarStatus *pVVar4;
  VarStatus *args_4;
  RowObjPS *in_RDI;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_R9;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_00000008;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  VarStatus VVar5;
  undefined4 in_stack_ffffffffffffff94;
  
  pdVar3 = VectorBase<double>::operator[]
                     ((VectorBase<double> *)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c);
  dVar1 = *pdVar3;
  pdVar3 = VectorBase<double>::operator[]
                     ((VectorBase<double> *)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c);
  dVar2 = *pdVar3;
  pdVar3 = VectorBase<double>::operator[]
                     ((VectorBase<double> *)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c);
  *pdVar3 = dVar1 - dVar2;
  pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,in_RDI->m_j);
  args_4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                     (in_stack_00000008,in_RDI->m_i);
  SPxOut::
  debug<soplex::SPxMainSM<double>::RowObjPS,_const_char_(&)[58],_const_int_&,_soplex::SPxSolverBase<double>::VarStatus_&,_const_int_&,_soplex::SPxSolverBase<double>::VarStatus_&,_0>
            (in_RDI,(char (*) [58])"RowObjPS: removing slack column {} ({}) for row {} ({}).\n",
             &in_RDI->m_j,pVVar4,&in_RDI->m_i,args_4);
  pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                     (in_stack_00000008,in_RDI->m_i);
  if (*pVVar4 != BASIC) {
    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,in_RDI->m_j);
    if (*pVVar4 == ON_UPPER) {
      pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (in_stack_00000008,in_RDI->m_i);
      *pVVar4 = ON_LOWER;
    }
    else if (*pVVar4 == ON_LOWER) {
      pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (in_stack_00000008,in_RDI->m_i);
      *pVVar4 = ON_UPPER;
    }
    else {
      pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,in_RDI->m_j);
      VVar5 = *pVVar4;
      pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (in_stack_00000008,in_RDI->m_i);
      *pVVar4 = VVar5;
    }
    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,in_RDI->m_j);
    *pVVar4 = ZERO;
  }
  return;
}

Assistant:

void SPxMainSM<R>::RowObjPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
                                     VectorBase<R>&,
                                     DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
                                     DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   s[m_i] = s[m_i] - x[m_j];

   assert(rStatus[m_i] != SPxSolverBase<R>::UNDEFINED);
   assert(cStatus[m_j] != SPxSolverBase<R>::UNDEFINED);
   assert(rStatus[m_i] != SPxSolverBase<R>::BASIC || cStatus[m_j] != SPxSolverBase<R>::BASIC);

   SPxOut::debug(this, "RowObjPS: removing slack column {} ({}) for row {} ({}).\n", m_j, cStatus[m_j],
                 m_i, rStatus[m_i]);

   if(rStatus[m_i] != SPxSolverBase<R>::BASIC)
   {
      switch(cStatus[m_j])
      {
      case SPxSolverBase<R>::ON_UPPER:
         rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
         break;

      case SPxSolverBase<R>::ON_LOWER:
         rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;
         break;

      default:
         rStatus[m_i] = cStatus[m_j];
      }

      // otherwise checkBasisDim() may fail
      cStatus[m_j] = SPxSolverBase<R>::ZERO;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      assert(false);
      throw SPxInternalCodeException("XMAISM15 Dimension doesn't match after this step.");
   }

#endif
}